

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

Maybe<capnp::ClientHook_&> __thiscall capnp::MembraneHook::getResolved(MembraneHook *this)

{
  undefined8 *puVar1;
  long *plVar2;
  _func_int **pp_Var3;
  long in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> OVar4;
  Own<capnp::ClientHook,_std::nullptr_t> newResolved;
  ClientHook *local_30;
  _func_int **local_28;
  
  if (*(long *)(in_RSI + 0x50) == 0) {
    (**(code **)(**(long **)(in_RSI + 0x28) + 0x10))(&stack0xffffffffffffffd0);
    if (local_30 == (ClientHook *)0x0) {
      (this->super_ClientHook)._vptr_ClientHook = (_func_int **)0x0;
    }
    else {
      OVar4 = wrap((MembraneHook *)&stack0xffffffffffffffd0,local_30,
                   *(MembranePolicy **)(in_RSI + 0x38),*(bool *)(in_RSI + 0x40));
      pp_Var3 = local_28;
      local_28 = (_func_int **)0x0;
      puVar1 = *(undefined8 **)(in_RSI + 0x48);
      plVar2 = *(long **)(in_RSI + 0x50);
      *(ClientHook **)(in_RSI + 0x48) = local_30;
      *(_func_int ***)(in_RSI + 0x50) = pp_Var3;
      if (plVar2 != (long *)0x0) {
        (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10),OVar4.ptr);
      }
      plVar2 = (long *)local_28;
      (this->super_ClientHook)._vptr_ClientHook = pp_Var3;
      if (local_28 != (_func_int **)0x0) {
        local_28 = (_func_int **)0x0;
        (**local_30->_vptr_ClientHook)(local_30,(long)plVar2 + *(long *)(*plVar2 + -0x10));
      }
    }
  }
  else {
    (this->super_ClientHook)._vptr_ClientHook = *(_func_int ***)(in_RSI + 0x50);
  }
  return (Maybe<capnp::ClientHook_&>)&this->super_ClientHook;
}

Assistant:

kj::Maybe<ClientHook&> getResolved() override {
    KJ_IF_SOME(r, resolved) {
      return *r;
    }

    KJ_IF_SOME(newInner, inner->getResolved()) {
      kj::Own<ClientHook> newResolved = wrap(newInner, *policy, reverse);
      ClientHook& result = *newResolved;
      resolved = kj::mv(newResolved);
      return result;
    } else {
      return kj::none;
    }
  }